

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O1

void __thiscall charls::encoder_strategy::end_scan(encoder_strategy *this)

{
  int iVar1;
  uint uVar2;
  
  flush(this);
  if (this->is_ff_written_ == true) {
    iVar1 = this->free_bit_count_;
    uVar2 = iVar1 + 6;
    if (-1 < (int)(iVar1 - 1U)) {
      uVar2 = iVar1 - 1U;
    }
    append_to_bit_stream(this,0,(iVar1 - (uVar2 & 0xfffffff8)) + -1);
  }
  flush(this);
  if (this->free_bit_count_ == 0x20) {
    return;
  }
  __assert_fail("free_bit_count_ == 32",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                ,0x5a,"void charls::encoder_strategy::end_scan()");
}

Assistant:

void end_scan()
    {
        flush();

        // if a 0xff was written, Flush() will force one unset bit anyway
        if (is_ff_written_)
        {
            append_to_bit_stream(0, (free_bit_count_ - 1) % 8);
        }

        flush();
        ASSERT(free_bit_count_ == 32);
    }